

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.cpp
# Opt level: O2

tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
* pstore::command_line::details::get_option_and_value
            (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
             *__return_storage_ptr__,string *arg)

{
  bool bVar1;
  ulong uVar2;
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void> value
  ;
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  value.storage_._8_8_ = 0;
  value.storage_._16_8_ = 0;
  value.valid_ = false;
  value._1_7_ = 0;
  value.storage_.__align = (anon_struct_8_0_00000001_for___align)0x0;
  value.storage_._24_8_ = 0;
  bVar1 = starts_with(arg,"--");
  if (bVar1) {
    uVar2 = std::__cxx11::string::find((char)arg,0x3d);
    if (uVar2 == 0xffffffffffffffff) {
      std::__cxx11::string::erase((ulong)arg,0);
    }
    else {
      std::__cxx11::string::substr((ulong)&local_48,(ulong)arg);
      maybe<std::__cxx11::string,void>::maybe<std::__cxx11::string,void>
                ((maybe<std::__cxx11::string,void> *)&local_70,&local_48);
      maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
      operator=(&value,&local_70);
      maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
      reset(&local_70);
      std::__cxx11::string::~string((string *)&local_48);
      if (uVar2 < 2) {
        assert_failed("equal_pos >= double_dash_len",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/command_line/command_line.cpp"
                      ,0x69);
      }
      std::__cxx11::string::substr((ulong)&local_70,(ulong)arg);
      std::__cxx11::string::operator=((string *)arg,(string *)&local_70);
      std::__cxx11::string::~string((string *)&local_70);
    }
  }
  else {
    bVar1 = starts_with(arg,"-");
    if (!bVar1) {
      assert_failed("starts_with (arg, \"-\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/command_line/command_line.cpp"
                    ,0x6d);
    }
    std::__cxx11::string::erase((ulong)arg,0);
  }
  std::_Tuple_impl<0ul,std::__cxx11::string,pstore::maybe<std::__cxx11::string,void>>::
  _Tuple_impl<std::__cxx11::string&,pstore::maybe<std::__cxx11::string,void>&,void>
            ((_Tuple_impl<0ul,std::__cxx11::string,pstore::maybe<std::__cxx11::string,void>> *)
             __return_storage_ptr__,arg,&value);
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
  reset(&value);
  return __return_storage_ptr__;
}

Assistant:

std::tuple<std::string, maybe<std::string>> get_option_and_value (std::string arg) {
                    static constexpr char double_dash[] = "--";
                    static constexpr auto double_dash_len = std::string::size_type{2};

                    auto value = nothing<std::string> ();
                    if (starts_with (arg, double_dash)) {
                        std::size_t const equal_pos = arg.find ('=', double_dash_len);
                        if (equal_pos == std::string::npos) {
                            arg.erase (0U, double_dash_len);
                        } else {
                            value = just (arg.substr (equal_pos + 1, std::string::npos));
                            PSTORE_ASSERT (equal_pos >= double_dash_len);
                            arg = arg.substr (double_dash_len, equal_pos - double_dash_len);
                        }
                    } else {
                        PSTORE_ASSERT (starts_with (arg, "-"));
                        arg.erase (0U, 1U);
                    }
                    return std::make_tuple (arg, value);
                }